

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O2

void __thiscall
CustomServer::on_message
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client,
          message<MsgType> *msg)

{
  MsgType MVar1;
  size_t in_RCX;
  int in_R8D;
  uint32_t local_34;
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  MVar1 = (msg->header).id;
  if (MVar1 == MessageAll) {
    (msg->header).id = ServerMessage;
    local_34 = ((client->
                super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->id_;
    blcl::net::operator<<(msg,&local_34);
    std::__shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &client->
                super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>);
    blcl::net::server_interface<MsgType>::broadcast_message
              (&this->super_server_interface<MsgType>,msg,
               (shared_ptr<blcl::net::connection<MsgType>_> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  else if (MVar1 == ServerPing) {
    blcl::net::connection<MsgType>::send
              ((client->
               super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(int)msg,msg,in_RCX,in_R8D);
    return;
  }
  return;
}

Assistant:

void on_message(std::shared_ptr<blcl::net::connection<MsgType>> client, blcl::net::message<MsgType>& msg) override {
        switch (msg.header.id) {
            case MsgType::ServerPing: {
                //std::cout << "[INFO] " << client->get_id() << ": Server Ping" << std::endl;
                client->send(msg);
                break;
            }
            case MsgType::MessageAll: {
               // std::cout << "[INFO] [" << std::chrono::system_clock::now().time_since_epoch().count() << "] " << client->get_id() << ": Broadcast\n";
//                blcl::net::message<MsgType> msg;
                msg.header.id = MsgType::ServerMessage;
                msg << client->get_id();
                broadcast_message(msg, client);
            }
        }
    }